

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap32::InduceFalsePositives(HeapBlockMap32 *this,Recycler *recycler)

{
  L2MapChunk *pLVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  void *candidate;
  uint j;
  long lVar2;
  uint i;
  long lVar3;
  
  lVar3 = 0;
  do {
    pLVar1 = this->map[lVar3];
    if (pLVar1 != (L2MapChunk *)0x0) {
      lVar2 = 0;
      do {
        this_00 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)pLVar1->map[lVar2];
        if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          candidate = GetAddressFromIds((uint)lVar3,(uint)lVar2);
          Recycler::TryMarkNonInterior(recycler,candidate,(void *)0x0);
        }
        else if ((this_00->super_HeapBlock).heapBlockType != LargeBlockType) {
          SmallHeapBlockT<SmallAllocationBlockAttributes>::InduceFalsePositive(this_00,recycler);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x100);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1000);
  return;
}

Assistant:

void
HeapBlockMap32::InduceFalsePositives(Recycler * recycler)
{
    for (uint i = 0; i < L1Count; i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk == nullptr)
        {
            continue;
        }

        for (uint j = 0; j < L2Count; j++)
        {
            HeapBlock * block = chunk->map[j];

            if (block == nullptr)
            {
                // Unallocated block.  Try to mark the first offset, in case
                // we are simultaneously allocating this block on the main thread.
                recycler->TryMarkNonInterior((void *)GetAddressFromIds(i, j), nullptr);
            }
            else if (!block->IsLargeHeapBlock())
            {
                ((SmallHeapBlock *)block)->InduceFalsePositive(recycler);
            }
        }
    }
}